

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  bool bVar1;
  Tables *this_00;
  Symbol SVar2;
  undefined1 local_88 [8];
  Symbol symbol;
  string local_68 [32];
  long local_48;
  size_type dot_pos;
  string prefix;
  string *name_local;
  DescriptorPool *this_local;
  
  prefix.field_2._8_8_ = name;
  std::__cxx11::string::string((string *)&dot_pos,(string *)name);
  do {
    local_48 = std::__cxx11::string::find_last_of((char)&dot_pos,0x2e);
    if (local_48 == -1) {
      if (this->underlay_ == (DescriptorPool *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = IsSubSymbolOfBuiltType(this->underlay_,(string *)prefix.field_2._8_8_);
      }
      goto LAB_00a74241;
    }
    std::__cxx11::string::substr((ulong)local_68,(ulong)&dot_pos);
    std::__cxx11::string::operator=((string *)&dot_pos,local_68);
    std::__cxx11::string::~string(local_68);
    this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                        (&this->tables_);
    SVar2 = Tables::FindSymbol(this_00,(string *)&dot_pos);
    symbol._0_8_ = SVar2.field_1;
    local_88._0_4_ = SVar2.type;
    bVar1 = Symbol::IsNull((Symbol *)local_88);
  } while ((bVar1) || (local_88._0_4_ == PACKAGE));
  this_local._7_1_ = true;
LAB_00a74241:
  std::__cxx11::string::~string((string *)&dot_pos);
  return this_local._7_1_;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const string& name) const {
  string prefix = name;
  for (;;) {
    string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != NULL) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}